

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderPrimitiveCoverage::initBufferObjects
          (TessellationShaderPrimitiveCoverage *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  GLfloat vertices [24];
  undefined8 auStack_88 [13];
  long lVar3;
  
  bVar7 = 0;
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  puVar5 = &DAT_01b5e8a0;
  puVar6 = auStack_88;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_bo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x212);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x215);
  (**(code **)(lVar3 + 0x150))(0x8892,0x60,auStack_88,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBufferData() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x218);
  (**(code **)(lVar3 + 0x19f0))(0,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x221);
  (**(code **)(lVar3 + 0x610))(0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x224);
  return;
}

Assistant:

void TessellationShaderPrimitiveCoverage::initBufferObjects(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up an array of vertices that will be fed into vertex shader */
	glw::GLfloat vertices[6 /* vertices */ * m_n_components /* components */] = {
		-1.0f, 1.0f, 0.0f, 1.0f, -1.0f, -1.0f, 0.0f, 1.0f, 1.0f,
		-1.0f, 0.0f, 1.0f,		 /* A half-screen triangle (patch) (CCW) is defined until here */
		1.0f,  1.0f, 0.0f, 1.0f, /* A full screen quad (patch) (CCW) is defined until here */
		-1.0f, 1.0f, 0.0f, 1.0f, 1.0f,  -1.0f, 0.0f, 1.0f /* A full screen quad (2 triangles) (CCW) is defined until here */
	};

	/* Configure a buffer object to hold vertex data */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed!");

	/* Configure "position" vertex attribute array and enable it */
	gl.vertexAttribPointer(0,		 /* index */
						   4,		 /* size */
						   GL_FLOAT, /* type */
						   GL_FALSE, /* normalized */
						   0,		 /* stride */
						   0);		 /* pointer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer() failed!");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() failed!");
}